

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshglob.c
# Opt level: O0

FT_Error psh_globals_new(FT_Memory memory,T1_Private *priv,PSH_Globals *aglobals)

{
  FT_Short FVar1;
  PSH_Globals local_70;
  FT_Short max_height;
  FT_Fixed max_scale;
  PSH_Width write_1;
  PSH_Dimension dim_1;
  PSH_Width write;
  PSH_Dimension dim;
  FT_Short *read;
  FT_UInt count;
  FT_Error error;
  PSH_Globals globals;
  PSH_Globals *aglobals_local;
  T1_Private *priv_local;
  FT_Memory memory_local;
  
  _count = (FT_Memory)0x0;
  globals = (PSH_Globals)aglobals;
  aglobals_local = (PSH_Globals *)priv;
  priv_local = (T1_Private *)memory;
  _count = (FT_Memory)ft_mem_qalloc(memory,0xf70,(FT_Error *)((long)&read + 4));
  if (read._4_4_ == 0) {
    _count->user = priv_local;
    *(uint *)&_count[0xd].alloc = (uint)*(ushort *)(aglobals_local + 0x10);
    dim_1 = (PSH_Dimension)(_count + 0xe);
    dim = (PSH_Dimension)(aglobals_local + 0x11);
    for (read._0_4_ = (uint)*(byte *)((long)aglobals_local + 0x84); (uint)read != 0;
        read._0_4_ = (uint)read - 1) {
      (dim_1->stdw).count = (int)(short)(dim->stdw).count;
      dim_1 = (PSH_Dimension)&(dim_1->stdw).widths[0].fit;
      dim = (PSH_Dimension)((long)&(dim->stdw).count + 2);
    }
    *(uint *)&_count[0xd].user = *(byte *)((long)aglobals_local + 0x84) + 1;
    *(uint *)&_count->free = (uint)*(ushort *)((long)aglobals_local + 0x82);
    max_scale = (FT_Fixed)&_count[1].alloc;
    dim = (PSH_Dimension)((long)aglobals_local + 0xa2);
    for (read._0_4_ = (uint)*(byte *)((long)aglobals_local + 0x85); (uint)read != 0;
        read._0_4_ = (uint)read - 1) {
      *(int *)max_scale = (int)(short)(dim->stdw).count;
      max_scale = max_scale + 0x18;
      dim = (PSH_Dimension)((long)&(dim->stdw).count + 2);
    }
    *(uint *)&_count->alloc = *(byte *)((long)aglobals_local + 0x85) + 1;
    psh_blues_set_zones((PSH_Blues)&_count[0x19].realloc,(uint)*(byte *)(aglobals_local + 1),
                        (FT_Short *)((long)aglobals_local + 0xc),
                        (uint)*(byte *)((long)aglobals_local + 9),(FT_Short *)(aglobals_local + 5),
                        *(FT_Int *)((long)aglobals_local + 0x7c),0);
    psh_blues_set_zones((PSH_Blues)&_count[0x19].realloc,(uint)*(byte *)((long)aglobals_local + 10),
                        (FT_Short *)((long)aglobals_local + 0x3c),
                        (uint)*(byte *)((long)aglobals_local + 0xb),
                        (FT_Short *)(aglobals_local + 0xb),*(FT_Int *)((long)aglobals_local + 0x7c),
                        1);
    FVar1 = psh_calc_max_height((uint)*(byte *)(aglobals_local + 1),
                                (FT_Short *)((long)aglobals_local + 0xc),1);
    FVar1 = psh_calc_max_height((uint)*(byte *)((long)aglobals_local + 9),
                                (FT_Short *)(aglobals_local + 5),FVar1);
    FVar1 = psh_calc_max_height((uint)*(byte *)((long)aglobals_local + 10),
                                (FT_Short *)((long)aglobals_local + 0x3c),FVar1);
    FVar1 = psh_calc_max_height((uint)*(byte *)((long)aglobals_local + 0xb),
                                (FT_Short *)(aglobals_local + 0xb),FVar1);
    local_70 = (PSH_Globals)FT_DivFix(1000,(long)FVar1);
    if ((long)aglobals_local[0xe] < (long)local_70) {
      local_70 = aglobals_local[0xe];
    }
    _count[0x7a].realloc = (FT_Realloc_Func)local_70;
    *(undefined4 *)&_count[0x7b].user = *(undefined4 *)(aglobals_local + 0xf);
    *(undefined4 *)&_count[0x7b].alloc = *(undefined4 *)((long)aglobals_local + 0x7c);
    _count[0xc].free = (FT_Free_Func)0x0;
    _count[0xc].realloc = (FT_Realloc_Func)0x0;
    _count[0x19].alloc = (FT_Alloc_Func)0x0;
    _count[0x19].free = (FT_Free_Func)0x0;
  }
  globals->memory = _count;
  return read._4_4_;
}

Assistant:

static FT_Error
  psh_globals_new( FT_Memory     memory,
                   T1_Private*   priv,
                   PSH_Globals  *aglobals )
  {
    PSH_Globals  globals = NULL;
    FT_Error     error;


    if ( !FT_QNEW( globals ) )
    {
      FT_UInt    count;
      FT_Short*  read;


      globals->memory = memory;

      /* copy standard widths */
      {
        PSH_Dimension  dim   = &globals->dimension[1];
        PSH_Width      write = dim->stdw.widths;


        write->org = priv->standard_width[0];
        write++;

        read = priv->snap_widths;
        for ( count = priv->num_snap_widths; count > 0; count-- )
        {
          write->org = *read;
          write++;
          read++;
        }

        dim->stdw.count = priv->num_snap_widths + 1;
      }

      /* copy standard heights */
      {
        PSH_Dimension  dim = &globals->dimension[0];
        PSH_Width      write = dim->stdw.widths;


        write->org = priv->standard_height[0];
        write++;
        read = priv->snap_heights;
        for ( count = priv->num_snap_heights; count > 0; count-- )
        {
          write->org = *read;
          write++;
          read++;
        }

        dim->stdw.count = priv->num_snap_heights + 1;
      }

      /* copy blue zones */
      psh_blues_set_zones( &globals->blues, priv->num_blue_values,
                           priv->blue_values, priv->num_other_blues,
                           priv->other_blues, priv->blue_fuzz, 0 );

      psh_blues_set_zones( &globals->blues, priv->num_family_blues,
                           priv->family_blues, priv->num_family_other_blues,
                           priv->family_other_blues, priv->blue_fuzz, 1 );

      /* limit the BlueScale value to `1 / max_of_blue_zone_heights' */
      {
        FT_Fixed  max_scale;
        FT_Short  max_height = 1;


        max_height = psh_calc_max_height( priv->num_blue_values,
                                          priv->blue_values,
                                          max_height );
        max_height = psh_calc_max_height( priv->num_other_blues,
                                          priv->other_blues,
                                          max_height );
        max_height = psh_calc_max_height( priv->num_family_blues,
                                          priv->family_blues,
                                          max_height );
        max_height = psh_calc_max_height( priv->num_family_other_blues,
                                          priv->family_other_blues,
                                          max_height );

        /* BlueScale is scaled 1000 times */
        max_scale = FT_DivFix( 1000, max_height );
        globals->blues.blue_scale = priv->blue_scale < max_scale
                                      ? priv->blue_scale
                                      : max_scale;
      }

      globals->blues.blue_shift = priv->blue_shift;
      globals->blues.blue_fuzz  = priv->blue_fuzz;

      globals->dimension[0].scale_mult  = 0;
      globals->dimension[0].scale_delta = 0;
      globals->dimension[1].scale_mult  = 0;
      globals->dimension[1].scale_delta = 0;

#ifdef DEBUG_HINTER
      ps_debug_globals = globals;
#endif
    }

    *aglobals = globals;
    return error;
  }